

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aig.h
# Opt level: O0

int Aig_ObjLevelNew(Aig_Obj_t *pObj)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  Aig_Obj_t *pAVar4;
  uint local_14;
  Aig_Obj_t *pObj_local;
  
  iVar2 = Aig_IsComplement(pObj);
  if (iVar2 == 0) {
    pAVar4 = Aig_ObjFanin1(pObj);
    if (pAVar4 == (Aig_Obj_t *)0x0) {
      pAVar4 = Aig_ObjFanin0(pObj);
      local_14 = (uint)((ulong)*(undefined8 *)&pAVar4->field_0x18 >> 0x20) & 0xffffff;
    }
    else {
      iVar2 = Aig_ObjIsExor(pObj);
      pAVar4 = Aig_ObjFanin0(pObj);
      uVar1 = *(undefined8 *)&pAVar4->field_0x18;
      pAVar4 = Aig_ObjFanin1(pObj);
      iVar3 = Abc_MaxInt((uint)((ulong)uVar1 >> 0x20) & 0xffffff,
                         (uint)((ulong)*(undefined8 *)&pAVar4->field_0x18 >> 0x20) & 0xffffff);
      local_14 = iVar2 + 1 + iVar3;
    }
    return local_14;
  }
  __assert_fail("!Aig_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                ,0x144,"int Aig_ObjLevelNew(Aig_Obj_t *)");
}

Assistant:

static inline int          Aig_ObjLevelNew( Aig_Obj_t * pObj )    { assert( !Aig_IsComplement(pObj) ); return Aig_ObjFanin1(pObj)? 1 + Aig_ObjIsExor(pObj) + Abc_MaxInt(Aig_ObjFanin0(pObj)->Level, Aig_ObjFanin1(pObj)->Level) : Aig_ObjFanin0(pObj)->Level; }